

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObject_private.hh
# Opt level: O0

void __thiscall QPDFObject::ChildDescr::~ChildDescr(ChildDescr *this)

{
  ChildDescr *this_local;
  
  std::__cxx11::string::~string((string *)&this->var_descr);
  std::weak_ptr<QPDFObject>::~weak_ptr(&this->parent);
  return;
}

Assistant:

ChildDescr(
            std::shared_ptr<QPDFObject> parent,
            std::string_view const& static_descr,
            std::string var_descr) :
            parent(parent),
            static_descr(static_descr),
            var_descr(var_descr)
        {
        }